

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O0

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::BadBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> sVar1;
  shared_ptr<CBlock> ret;
  CTransactionRef tx;
  CMutableTransaction coinbase_spend;
  shared_ptr<CBlock> pblock;
  undefined4 in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  CMutableTransaction *in_stack_fffffffffffffeb0;
  COutPoint *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffec0;
  CScript *in_stack_fffffffffffffec8;
  COutPoint *__args;
  vector<CTxIn,_std::allocator<CTxIn>_> *this_00;
  shared_ptr<CBlock> *in_stack_ffffffffffffff40;
  MinerTestingSetup *in_stack_ffffffffffffff48;
  uint256 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  vector<CTxIn,_std::allocator<CTxIn>_> local_a0 [3];
  COutPoint local_58 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Block((MinerTestingSetup *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
        in_stack_ffffffffffffff50);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  this_00 = local_a0;
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  COutPoint::COutPoint
            (in_stack_fffffffffffffeb8,(Txid *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_58[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  __args = local_58;
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            (this_00,__args,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffeb8,
             (size_type)in_stack_fffffffffffffeb0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffeb8,
             (value_type *)in_stack_fffffffffffffeb0);
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffeb0);
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffffeb8,(value_type *)in_stack_fffffffffffffeb0);
  std::shared_ptr<CBlock>::shared_ptr
            ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (shared_ptr<CBlock> *)0xcb42c3);
  FinalizeBlock(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::shared_ptr<CBlock>::~shared_ptr
            ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (shared_ptr<CBlock> *)0xcb4300);
  std::shared_ptr<CBlock>::~shared_ptr
            ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::shared_ptr<CBlock>::~shared_ptr
            ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    sVar1.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<const_CBlock>)
           sVar1.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::BadBlock(const uint256& prev_hash)
{
    auto pblock = Block(prev_hash);

    CMutableTransaction coinbase_spend;
    coinbase_spend.vin.emplace_back(COutPoint(pblock->vtx[0]->GetHash(), 0), CScript(), 0);
    coinbase_spend.vout.push_back(pblock->vtx[0]->vout[0]);

    CTransactionRef tx = MakeTransactionRef(coinbase_spend);
    pblock->vtx.push_back(tx);

    auto ret = FinalizeBlock(pblock);
    return ret;
}